

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strdup.c
# Opt level: O2

void * Curl_memdup0(char *src,size_t length)

{
  void *__dest;
  
  __dest = (*Curl_cmalloc)(length + 1);
  if (__dest != (void *)0x0) {
    memcpy(__dest,src,length);
    *(undefined1 *)((long)__dest + length) = 0;
  }
  return __dest;
}

Assistant:

void *Curl_memdup0(const char *src, size_t length)
{
  char *buf = malloc(length + 1);
  if(!buf)
    return NULL;
  memcpy(buf, src, length);
  buf[length] = 0;
  return buf;
}